

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePrimalActivity
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *primal,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *activity,bool unscaled)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar8;
  Item *pIVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  undefined8 *puVar11;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  long lVar12;
  long lVar13;
  int n;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  type t;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  cpp_dec_float<50U,_int,_void> local_98;
  long local_60;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_58;
  _func_int **local_38;
  
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(primal->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_98.data._M_elems._0_8_ = local_98.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "XSPXLP01 Primal vector for computing row activity has wrong dimension","");
    *puVar11 = &PTR__SPxException_003af870;
    puVar11[1] = puVar11 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar11 + 1),local_98.data._M_elems._0_8_,
               local_98.data._M_elems._0_8_ + local_98.data._M_elems._8_8_);
    *puVar11 = &PTR__SPxException_003b0638;
    __cxa_throw(puVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(activity->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_98.data._M_elems._0_8_ = local_98.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "XSPXLP03 Activity vector computing row activity has wrong dimension","");
    *puVar11 = &PTR__SPxException_003af870;
    puVar11[1] = puVar11 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar11 + 1),local_98.data._M_elems._0_8_,
               local_98.data._M_elems._0_8_ + local_98.data._M_elems._8_8_);
    *puVar11 = &PTR__SPxException_003b0638;
    __cxa_throw(puVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum < 1) {
    uVar15 = 0;
  }
  else {
    lVar16 = 0;
    uVar15 = 0;
    do {
      pnVar8 = (primal->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)(&(pnVar8->m_backend).data + 1) + lVar16 + 8U) == 2) break;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_98,0,(type *)0x0);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        ((cpp_dec_float<50U,_int,_void> *)
                         ((long)(pnVar8->m_backend).data._M_elems + lVar16),&local_98);
      if (iVar7 != 0) break;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x38;
    } while ((long)uVar15 <
             (long)(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  if ((int)uVar15 <
      (this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum) {
    iVar7 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    local_58.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    local_58.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memsize = 0;
    local_58.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_38 = (_func_int **)&PTR__DSVectorBase_003b4310;
    local_58._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b4310;
    local_58.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    n = 2;
    if (0 < iVar7) {
      n = iVar7;
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem(&local_58,n);
    uVar17 = uVar15 & 0xffffffff;
    if ((unscaled) && (this->_isScaled == true)) {
      (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,uVar15 & 0xffffffff,&local_58);
      pnVar2 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar8 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar8 != pnVar2; pnVar8 = pnVar8 + 1
          ) {
        (pnVar8->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar8->m_backend).prec_elem = 10;
        (pnVar8->m_backend).data._M_elems[0] = 0;
        (pnVar8->m_backend).data._M_elems[1] = 0;
        (pnVar8->m_backend).data._M_elems[2] = 0;
        (pnVar8->m_backend).data._M_elems[3] = 0;
        (pnVar8->m_backend).data._M_elems[4] = 0;
        (pnVar8->m_backend).data._M_elems[5] = 0;
        (pnVar8->m_backend).data._M_elems[6] = 0;
        (pnVar8->m_backend).data._M_elems[7] = 0;
        *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x1d) = 0;
        *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x25) = 0;
      }
      if (0 < (long)local_58.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
        lVar16 = 0;
        do {
          iVar7 = *(int *)((long)(&(local_58.
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar16);
          pnVar8 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar8[iVar7].m_backend.data._M_elems + 8) =
               *(undefined8 *)
                ((long)((local_58.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem)->val).m_backend.data._M_elems + lVar16 + 0x20);
          puVar11 = (undefined8 *)
                    ((long)((local_58.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar16);
          uVar3 = *puVar11;
          uVar5 = puVar11[1];
          puVar11 = (undefined8 *)
                    ((long)((local_58.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar16 + 0x10);
          uVar6 = puVar11[1];
          puVar1 = pnVar8[iVar7].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = *puVar11;
          *(undefined8 *)(puVar1 + 2) = uVar6;
          *(undefined8 *)&pnVar8[iVar7].m_backend.data = uVar3;
          *(undefined8 *)(pnVar8[iVar7].m_backend.data._M_elems + 2) = uVar5;
          pnVar8[iVar7].m_backend.exp =
               *(int *)((long)(&((local_58.
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val).m_backend.data + 1) + lVar16);
          pnVar8[iVar7].m_backend.neg =
               *(bool *)((long)(&((local_58.
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val).m_backend.data + 1) + lVar16 + 4);
          uVar3 = *(undefined8 *)
                   ((long)(&((local_58.
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem)->val).m_backend.data + 1) + lVar16 + 8);
          pnVar8[iVar7].m_backend.fpclass = (int)uVar3;
          pnVar8[iVar7].m_backend.prec_elem = (int)((ulong)uVar3 >> 0x20);
          lVar16 = lVar16 + 0x3c;
        } while ((long)local_58.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused * 0x3c - lVar16 != 0);
      }
    }
    else {
      pIVar9 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[uVar17].idx;
      pnVar2 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar8 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar8 != pnVar2; pnVar8 = pnVar8 + 1
          ) {
        (pnVar8->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar8->m_backend).prec_elem = 10;
        (pnVar8->m_backend).data._M_elems[0] = 0;
        (pnVar8->m_backend).data._M_elems[1] = 0;
        (pnVar8->m_backend).data._M_elems[2] = 0;
        (pnVar8->m_backend).data._M_elems[3] = 0;
        (pnVar8->m_backend).data._M_elems[4] = 0;
        (pnVar8->m_backend).data._M_elems[5] = 0;
        (pnVar8->m_backend).data._M_elems[6] = 0;
        (pnVar8->m_backend).data._M_elems[7] = 0;
        *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x1d) = 0;
        *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x25) = 0;
      }
      if (0 < (pIVar9->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar16 = 0x38;
        lVar12 = 0;
        do {
          pNVar4 = (pIVar9->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          iVar7 = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar16);
          pnVar8 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar8[iVar7].m_backend.data._M_elems + 8) =
               *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar16 + -0x18);
          puVar11 = (undefined8 *)((long)(&pNVar4->val + -1) + lVar16);
          uVar3 = *puVar11;
          uVar5 = puVar11[1];
          puVar11 = (undefined8 *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar16);
          uVar6 = puVar11[1];
          puVar1 = pnVar8[iVar7].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = *puVar11;
          *(undefined8 *)(puVar1 + 2) = uVar6;
          *(undefined8 *)&pnVar8[iVar7].m_backend.data = uVar3;
          *(undefined8 *)(pnVar8[iVar7].m_backend.data._M_elems + 2) = uVar5;
          pnVar8[iVar7].m_backend.exp =
               *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar16 + -0x10);
          pnVar8[iVar7].m_backend.neg =
               *(bool *)((long)(pNVar4->val).m_backend.data._M_elems + lVar16 + -0xc);
          uVar3 = *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar16 + -8);
          pnVar8[iVar7].m_backend.fpclass = (int)uVar3;
          pnVar8[iVar7].m_backend.prec_elem = (int)((ulong)uVar3 >> 0x20);
          lVar12 = lVar12 + 1;
          lVar16 = lVar16 + 0x3c;
        } while (lVar12 < (pIVar9->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)activity,
                 (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17);
    if ((int)uVar15 + 1 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum) {
      lVar16 = uVar17 + 1;
      do {
        pnVar8 = (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_60 = lVar16;
        if (pnVar8[lVar16].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0024ac0d:
          if ((unscaled) && (this->_isScaled == true)) {
            (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,local_60,&local_58);
            lVar12 = (long)local_58.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar12) {
              pcVar18 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
              lVar13 = lVar12 + 1;
              lVar16 = lVar12 * 0x3c;
              do {
                pcVar10 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)local_58.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar16);
                local_98.fpclass = cpp_dec_float_finite;
                local_98.prec_elem = 10;
                local_98.data._M_elems[0] = 0;
                local_98.data._M_elems[1] = 0;
                local_98.data._M_elems[2] = 0;
                local_98.data._M_elems[3] = 0;
                local_98.data._M_elems[4] = 0;
                local_98.data._M_elems[5] = 0;
                local_98.data._M_elems._24_5_ = 0;
                local_98.data._M_elems[7]._1_3_ = 0;
                local_98.data._M_elems._32_5_ = 0;
                local_98.data._M_elems[9]._1_3_ = 0;
                local_98.exp = 0;
                local_98.neg = false;
                pcVar14 = pcVar18;
                if ((pcVar10 != &local_98) && (pcVar14 = pcVar10, &local_98 != pcVar18)) {
                  uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                  local_98.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_98.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
                  local_98.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
                  local_98.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                  local_98.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_98.exp = pcVar18->exp;
                  local_98.neg = pcVar18->neg;
                  local_98.fpclass = pcVar18->fpclass;
                  local_98.prec_elem = pcVar18->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_98,pcVar14);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&local_58.
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar16)].m_backend,&local_98);
                lVar13 = lVar13 + -1;
                lVar16 = lVar16 + -0x3c;
              } while (1 < lVar13);
            }
          }
          else {
            pIVar9 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar7 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[local_60].idx;
            lVar12 = (long)pIVar9[iVar7].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar12) {
              pcVar18 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
              pIVar9 = pIVar9 + iVar7;
              lVar13 = lVar12 + 1;
              lVar16 = lVar12 * 0x3c;
              do {
                pcVar10 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(pIVar9->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar16);
                local_98.fpclass = cpp_dec_float_finite;
                local_98.prec_elem = 10;
                local_98.data._M_elems[0] = 0;
                local_98.data._M_elems[1] = 0;
                local_98.data._M_elems[2] = 0;
                local_98.data._M_elems[3] = 0;
                local_98.data._M_elems[4] = 0;
                local_98.data._M_elems[5] = 0;
                local_98.data._M_elems._24_5_ = 0;
                local_98.data._M_elems[7]._1_3_ = 0;
                local_98.data._M_elems._32_5_ = 0;
                local_98.data._M_elems[9]._1_3_ = 0;
                local_98.exp = 0;
                local_98.neg = false;
                pcVar14 = pcVar18;
                if ((pcVar10 != &local_98) && (pcVar14 = pcVar10, &local_98 != pcVar18)) {
                  uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
                  local_98.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_98.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
                  local_98.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
                  local_98.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
                  local_98.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_98.exp = pcVar18->exp;
                  local_98.neg = pcVar18->neg;
                  local_98.fpclass = pcVar18->fpclass;
                  local_98.prec_elem = pcVar18->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_98,pcVar14);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar9->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar16)].m_backend,&local_98);
                lVar13 = lVar13 + -1;
                lVar16 = lVar16 + -0x3c;
              } while (1 < lVar13);
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_98,0,(type *)0x0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&pnVar8[lVar16].m_backend,&local_98);
          if (iVar7 != 0) goto LAB_0024ac0d;
        }
        lVar16 = local_60 + 1;
      } while ((int)lVar16 <
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    }
    local_58._vptr_DSVectorBase = local_38;
    if (local_58.theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_58.theelem);
    }
  }
  else {
    pnVar2 = (activity->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar8 = (activity->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar8 != pnVar2; pnVar8 = pnVar8 + 1)
    {
      (pnVar8->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar8->m_backend).prec_elem = 10;
      (pnVar8->m_backend).data._M_elems[0] = 0;
      (pnVar8->m_backend).data._M_elems[1] = 0;
      (pnVar8->m_backend).data._M_elems[2] = 0;
      (pnVar8->m_backend).data._M_elems[3] = 0;
      (pnVar8->m_backend).data._M_elems[4] = 0;
      (pnVar8->m_backend).data._M_elems[5] = 0;
      (pnVar8->m_backend).data._M_elems[6] = 0;
      (pnVar8->m_backend).data._M_elems[7] = 0;
      *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x1d) = 0;
      *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x25) = 0;
    }
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::computePrimalActivity(const VectorBase<R>& primal, VectorBase<R>& activity,
      const bool unscaled) const
{
   if(primal.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP01 Primal vector for computing row activity has wrong dimension");

   if(activity.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP03 Activity vector computing row activity has wrong dimension");

   int c;

   for(c = 0; c < nCols() && primal[c] == 0; c++)
      ;

   if(c >= nCols())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nRows());

   if(unscaled && _isScaled)
   {
      lp_scaler->getColUnscaled(*this, c, tmp);
      activity = tmp;
   }
   else
      activity = colVector(c);

   activity *= primal[c];
   c++;

   for(; c < nCols(); c++)
   {
      if(primal[c] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getColUnscaled(*this, c, tmp);
            activity.multAdd(primal[c], tmp);
         }
         else
            activity.multAdd(primal[c], colVector(c));
      }
   }
}